

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__jpeg_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  byte bVar2;
  short sVar3;
  int *piVar4;
  byte bVar5;
  stbi_uc sVar6;
  int iVar7;
  stbi__uint32 sVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  stbi__jpeg *z;
  char *pcVar12;
  long lVar13;
  ulong uVar14;
  void *pvVar15;
  code *pcVar16;
  undefined8 *puVar17;
  stbi_uc *psVar18;
  int iVar19;
  long lVar20;
  undefined8 *puVar21;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint uVar22;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  int why;
  uint why_00;
  undefined8 extraout_RDX;
  anon_struct_96_18_0d0905d3 *extraout_RDX_00;
  anon_struct_96_18_0d0905d3 *extraout_RDX_01;
  anon_struct_96_18_0d0905d3 *extraout_RDX_02;
  anon_struct_96_18_0d0905d3 *paVar23;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  ulong extraout_RDX_12;
  ulong extraout_RDX_13;
  undefined8 extraout_RDX_14;
  undefined8 extraout_RDX_15;
  undefined8 uVar24;
  stbi_uc **ppsVar25;
  undefined1 *puVar26;
  byte *pbVar27;
  stbi__context *psVar28;
  ulong uVar29;
  short *psVar30;
  long lVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  uint uVar35;
  int iVar36;
  uint uVar37;
  ulong uVar38;
  short sVar39;
  stbi__huffman *psVar40;
  long in_FS_OFFSET;
  bool bVar41;
  stbi_uc *coutput [4];
  short data [64];
  int local_1bc;
  ulong local_188;
  stbi_uc *local_158 [3];
  long lStack_140;
  int local_138;
  int local_134;
  int *local_130;
  anon_struct_96_18_0d0905d3 *local_128;
  long local_120;
  stbi__uint32 *local_118;
  int *local_110;
  stbi__huffman *local_108;
  stbi__uint32 *local_100;
  short local_f8 [4];
  long local_f0 [2];
  int local_e0 [44];
  
  local_100 = (stbi__uint32 *)x;
  z = (stbi__jpeg *)malloc(0x4888);
  if (z == (stbi__jpeg *)0x0) {
    *(char **)(in_FS_OFFSET + -0x20) = "outofmem";
    pvVar15 = (void *)0x0;
  }
  else {
    z->s = s;
    z->idct_block_kernel = stbi__idct_simd;
    z->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
    z->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      paVar1 = z->img_comp;
      lVar13 = 0x46d8;
      do {
        psVar18 = z->huff_dc[0].fast + lVar13 + -8;
        psVar18[0] = '\0';
        psVar18[1] = '\0';
        psVar18[2] = '\0';
        psVar18[3] = '\0';
        psVar18[4] = '\0';
        psVar18[5] = '\0';
        psVar18[6] = '\0';
        psVar18[7] = '\0';
        psVar18[8] = '\0';
        psVar18[9] = '\0';
        psVar18[10] = '\0';
        psVar18[0xb] = '\0';
        psVar18[0xc] = '\0';
        psVar18[0xd] = '\0';
        psVar18[0xe] = '\0';
        psVar18[0xf] = '\0';
        lVar13 = lVar13 + 0x60;
      } while (lVar13 != 0x4858);
      z->restart_interval = 0;
      local_118 = (stbi__uint32 *)y;
      local_110 = comp;
      iVar7 = stbi__decode_jpeg_header(z,0);
      uVar35 = extraout_EDX;
      if (iVar7 != 0) {
        bVar5 = stbi__get_marker(z);
        local_130 = z->huff_ac[0].delta + 9;
        uVar24 = extraout_RDX;
LAB_00111817:
        uVar35 = (uint)uVar24;
        if (bVar5 != 0xda) {
          if (bVar5 == 0xdc) {
            iVar7 = stbi__get16be(z->s);
            sVar8 = stbi__get16be(z->s);
            paVar23 = extraout_RDX_00;
            if (iVar7 == 4) {
              if (sVar8 == z->s->img_y) goto LAB_00112bf4;
              pcVar12 = "bad DNL height";
            }
            else {
              pcVar12 = "bad DNL len";
            }
            goto LAB_001136a4;
          }
          if (bVar5 == 0xd9) {
            if ((z->progressive != 0) && (0 < z->s->img_n)) {
              lVar13 = 0;
              do {
                iVar7 = z->img_comp[lVar13].y + 7 >> 3;
                if (0 < iVar7) {
                  uVar35 = paVar1[lVar13].x + 7 >> 3;
                  iVar36 = 0;
                  do {
                    if (0 < (int)uVar35) {
                      uVar38 = 0;
                      do {
                        psVar30 = paVar1[lVar13].coeff +
                                  (paVar1[lVar13].coeff_w * iVar36 + (int)uVar38) * 0x40;
                        iVar33 = paVar1[lVar13].tq;
                        lVar20 = 0;
                        do {
                          psVar30[lVar20] = psVar30[lVar20] * z->dequant[iVar33][lVar20];
                          lVar20 = lVar20 + 1;
                        } while (lVar20 != 0x40);
                        (*z->idct_block_kernel)
                                  (paVar1[lVar13].data +
                                   uVar38 * 8 + (long)(iVar36 * 8 * paVar1[lVar13].w2),
                                   paVar1[lVar13].w2,psVar30);
                        uVar38 = uVar38 + 1;
                        uVar24 = extraout_RDX_15;
                      } while (uVar38 != uVar35);
                    }
                    iVar36 = iVar36 + 1;
                  } while (iVar36 != iVar7);
                }
                uVar35 = (uint)uVar24;
                lVar13 = lVar13 + 1;
              } while (lVar13 < z->s->img_n);
            }
            if (req_comp == 0) {
              req_comp = (uint)(2 < z->s->img_n) * 2 + 1;
            }
            uVar11 = z->s->img_n;
            if (uVar11 == 3) {
              bVar41 = true;
              if (z->rgb != 3) {
                if (z->app14_color_transform != 0) goto LAB_00112e17;
                bVar41 = z->jfif == 0;
              }
            }
            else {
LAB_00112e17:
              bVar41 = false;
            }
            uVar37 = 1;
            if (bVar41) {
              uVar37 = uVar11;
            }
            if (2 < req_comp) {
              uVar37 = uVar11;
            }
            if (uVar11 != 3) {
              uVar37 = uVar11;
            }
            if ((int)uVar37 < 1) goto LAB_001136b4;
            local_158[2] = (stbi_uc *)0x0;
            lStack_140 = 0;
            local_158[0] = (stbi_uc *)0x0;
            local_158[1] = (stbi_uc *)0x0;
            lVar13 = 0;
            do {
              psVar28 = z->s;
              sVar8 = psVar28->img_x;
              pvVar15 = malloc((ulong)(sVar8 + 3));
              *(void **)((long)&z->img_comp[0].linebuf + lVar13 * 2) = pvVar15;
              if (pvVar15 == (void *)0x0) {
                stbi__free_jpeg_components(z,psVar28->img_n,why);
                *(char **)(in_FS_OFFSET + -0x20) = "outofmem";
              }
              else {
                uVar38 = (long)z->img_h_max / (long)*(int *)((long)&z->img_comp[0].h + lVar13 * 2);
                iVar7 = (int)uVar38;
                *(int *)((long)local_e0 + lVar13) = iVar7;
                iVar36 = z->img_v_max / *(int *)((long)&z->img_comp[0].v + lVar13 * 2);
                *(int *)((long)local_e0 + lVar13 + 4) = iVar36;
                *(int *)((long)local_e0 + lVar13 + 0xc) = iVar36 >> 1;
                *(int *)((long)local_e0 + lVar13 + 8) =
                     (int)((ulong)((sVar8 + iVar7) - 1) / (uVar38 & 0xffffffff));
                *(undefined4 *)((long)local_e0 + lVar13 + 0x10) = 0;
                uVar24 = *(undefined8 *)((long)&z->img_comp[0].data + lVar13 * 2);
                *(undefined8 *)((long)local_f0 + lVar13 + 8) = uVar24;
                *(undefined8 *)((long)local_f0 + lVar13) = uVar24;
                if ((iVar7 == 1) && (iVar36 == 1)) {
                  pcVar16 = resample_row_1;
                }
                else if ((iVar7 == 1) && (iVar36 == 2)) {
                  pcVar16 = stbi__resample_row_v_2;
                }
                else if ((iVar7 == 2) && (iVar36 == 1)) {
                  pcVar16 = stbi__resample_row_h_2;
                }
                else if ((iVar7 == 2) && (iVar36 == 2)) {
                  pcVar16 = z->resample_row_hv_2_kernel;
                }
                else {
                  pcVar16 = stbi__resample_row_generic;
                }
                *(code **)((long)local_f8 + lVar13) = pcVar16;
              }
              if (pvVar15 == (void *)0x0) goto LAB_001136bc;
              lVar13 = lVar13 + 0x30;
            } while ((ulong)uVar37 * 0x30 != lVar13);
            psVar28 = z->s;
            sVar8 = psVar28->img_y;
            pvVar15 = stbi__malloc_mad3(req_comp,psVar28->img_x,sVar8,1);
            if (pvVar15 == (void *)0x0) {
              stbi__free_jpeg_components(z,psVar28->img_n,why_00);
              pcVar12 = "outofmem";
              goto LAB_0011174a;
            }
            uVar35 = why_00;
            if (sVar8 != 0) {
              iVar7 = 0;
              uVar11 = 0;
              do {
                sVar8 = psVar28->img_x;
                ppsVar25 = local_158;
                lVar13 = 0;
                do {
                  puVar17 = (undefined8 *)((long)local_f0 + lVar13 + 8);
                  iVar36 = *(int *)((long)local_e0 + lVar13 + 0xc);
                  iVar33 = *(int *)((long)local_e0 + lVar13 + 4);
                  iVar19 = iVar33 >> 1;
                  puVar21 = puVar17;
                  if (iVar36 < iVar19) {
                    puVar21 = (undefined8 *)((long)local_f0 + lVar13);
                  }
                  if (iVar19 <= iVar36) {
                    puVar17 = (undefined8 *)((long)local_f0 + lVar13);
                  }
                  psVar18 = (stbi_uc *)
                            (**(code **)((long)local_f8 + lVar13))
                                      (*(undefined8 *)((long)&z->img_comp[0].linebuf + lVar13 * 2),
                                       *puVar21,*puVar17,
                                       *(undefined4 *)((long)local_e0 + lVar13 + 8));
                  *ppsVar25 = psVar18;
                  *(int *)((long)local_e0 + lVar13 + 0xc) = iVar36 + 1;
                  if (iVar33 <= iVar36 + 1) {
                    *(undefined4 *)((long)local_e0 + lVar13 + 0xc) = 0;
                    lVar20 = *(long *)((long)local_f0 + lVar13 + 8);
                    *(long *)((long)local_f0 + lVar13) = lVar20;
                    iVar36 = *(int *)((long)local_e0 + lVar13 + 0x10) + 1;
                    *(int *)((long)local_e0 + lVar13 + 0x10) = iVar36;
                    if (iVar36 < *(int *)((long)&z->img_comp[0].y + lVar13 * 2)) {
                      *(long *)((long)local_f0 + lVar13 + 8) =
                           lVar20 + *(int *)((long)&z->img_comp[0].w2 + lVar13 * 2);
                    }
                  }
                  lVar13 = lVar13 + 0x30;
                  ppsVar25 = ppsVar25 + 1;
                } while ((ulong)uVar37 * 0x30 != lVar13);
                if (req_comp < 3) {
                  psVar28 = z->s;
                  if (bVar41) {
                    if (req_comp == 1) {
                      if (psVar28->img_x != 0) {
                        uVar38 = 0;
                        do {
                          bVar5 = local_158[2][uVar38];
                          *(char *)((long)pvVar15 + uVar38 + sVar8 * iVar7) =
                               (char)((uint)bVar5 * 2 + ((uint)bVar5 + (uint)bVar5 * 8) * 3 +
                                      (uint)local_158[1][uVar38] * 0x96 +
                                      (uint)local_158[0][uVar38] * 0x4d >> 8);
                          uVar38 = uVar38 + 1;
                        } while (uVar38 < psVar28->img_x);
                      }
                    }
                    else if (psVar28->img_x != 0) {
                      uVar38 = 0;
                      do {
                        bVar5 = local_158[2][uVar38];
                        *(char *)((long)pvVar15 + uVar38 * 2 + (ulong)(sVar8 * iVar7)) =
                             (char)((uint)bVar5 * 2 + ((uint)bVar5 + (uint)bVar5 * 8) * 3 +
                                    (uint)local_158[1][uVar38] * 0x96 +
                                    (uint)local_158[0][uVar38] * 0x4d >> 8);
                        *(undefined1 *)((long)pvVar15 + uVar38 * 2 + (ulong)(sVar8 * iVar7) + 1) =
                             0xff;
                        uVar38 = uVar38 + 1;
                      } while (uVar38 < psVar28->img_x);
                    }
                  }
                  else if (psVar28->img_n == 4) {
                    if (z->app14_color_transform == 2) {
                      if (psVar28->img_x != 0) {
                        puVar26 = (undefined1 *)((long)pvVar15 + (ulong)(sVar8 * iVar7) + 1);
                        uVar38 = 0;
                        do {
                          iVar36 = (local_158[0][uVar38] ^ 0xff) *
                                   (uint)*(byte *)(lStack_140 + uVar38);
                          puVar26[-1] = (char)((iVar36 + 0x80U >> 8) + iVar36 + 0x80 >> 8);
                          *puVar26 = 0xff;
                          uVar38 = uVar38 + 1;
                          puVar26 = puVar26 + (uint)req_comp;
                        } while (uVar38 < psVar28->img_x);
                      }
                    }
                    else {
                      if (z->app14_color_transform != 0) goto LAB_001133e1;
                      if (psVar28->img_x != 0) {
                        puVar26 = (undefined1 *)((long)pvVar15 + (ulong)(sVar8 * iVar7) + 1);
                        uVar38 = 0;
                        do {
                          bVar5 = *(byte *)(lStack_140 + uVar38);
                          iVar36 = (uint)local_158[0][uVar38] * (uint)bVar5;
                          iVar33 = (uint)local_158[1][uVar38] * (uint)bVar5;
                          puVar26[-1] = (char)(((uint)local_158[2][uVar38] * (uint)bVar5 +
                                                ((uint)local_158[2][uVar38] * (uint)bVar5 + 0x80 >>
                                                8) + 0x80 >> 8 & 0xff) * 0x1d +
                                               (iVar33 + (iVar33 + 0x80U >> 8) + 0x80 >> 8 & 0xff) *
                                               0x96 + (iVar36 + (iVar36 + 0x80U >> 8) + 0x80 >> 8 &
                                                      0xff) * 0x4d >> 8);
                          *puVar26 = 0xff;
                          uVar38 = uVar38 + 1;
                          puVar26 = puVar26 + (uint)req_comp;
                        } while (uVar38 < psVar28->img_x);
                      }
                    }
                  }
                  else {
LAB_001133e1:
                    if (req_comp == 1) {
                      if (psVar28->img_x != 0) {
                        uVar38 = 0;
                        do {
                          *(stbi_uc *)((long)pvVar15 + uVar38 + sVar8 * iVar7) =
                               local_158[0][uVar38];
                          uVar38 = uVar38 + 1;
                        } while (uVar38 < psVar28->img_x);
                      }
                    }
                    else if (psVar28->img_x != 0) {
                      uVar38 = 0;
                      do {
                        *(stbi_uc *)((long)pvVar15 + uVar38 * 2 + (ulong)(sVar8 * iVar7)) =
                             local_158[0][uVar38];
                        *(undefined1 *)((long)pvVar15 + uVar38 * 2 + (ulong)(sVar8 * iVar7) + 1) =
                             0xff;
                        uVar38 = uVar38 + 1;
                      } while (uVar38 < psVar28->img_x);
                    }
                  }
                }
                else {
                  psVar18 = (stbi_uc *)((ulong)(uVar11 * req_comp * sVar8) + (long)pvVar15);
                  psVar28 = z->s;
                  if (psVar28->img_n == 3) {
                    if (bVar41) {
                      if (psVar28->img_x != 0) {
                        puVar26 = (undefined1 *)((long)pvVar15 + (ulong)(sVar8 * iVar7) + 3);
                        uVar38 = 0;
                        do {
                          puVar26[-3] = local_158[0][uVar38];
                          puVar26[-2] = local_158[1][uVar38];
                          puVar26[-1] = local_158[2][uVar38];
                          *puVar26 = 0xff;
                          uVar38 = uVar38 + 1;
                          puVar26 = puVar26 + (uint)req_comp;
                        } while (uVar38 < psVar28->img_x);
                      }
                    }
                    else {
LAB_00113451:
                      (*z->YCbCr_to_RGB_kernel)
                                (psVar18,local_158[0],local_158[1],local_158[2],psVar28->img_x,
                                 req_comp);
                    }
                  }
                  else if (psVar28->img_n == 4) {
                    if (z->app14_color_transform == 2) {
                      (*z->YCbCr_to_RGB_kernel)
                                (psVar18,local_158[0],local_158[1],local_158[2],psVar28->img_x,
                                 req_comp);
                      psVar28 = z->s;
                      if (psVar28->img_x != 0) {
                        pbVar27 = (byte *)((long)pvVar15 + (ulong)(sVar8 * iVar7) + 2);
                        uVar38 = 0;
                        do {
                          bVar5 = *(byte *)(lStack_140 + uVar38);
                          iVar36 = (pbVar27[-2] ^ 0xff) * (uint)bVar5;
                          pbVar27[-2] = (byte)((iVar36 + 0x80U >> 8) + iVar36 + 0x80 >> 8);
                          iVar36 = (pbVar27[-1] ^ 0xff) * (uint)bVar5;
                          pbVar27[-1] = (byte)((iVar36 + 0x80U >> 8) + iVar36 + 0x80 >> 8);
                          iVar36 = (*pbVar27 ^ 0xff) * (uint)bVar5;
                          *pbVar27 = (byte)((iVar36 + 0x80U >> 8) + iVar36 + 0x80 >> 8);
                          uVar38 = uVar38 + 1;
                          pbVar27 = pbVar27 + (uint)req_comp;
                        } while (uVar38 < psVar28->img_x);
                      }
                    }
                    else {
                      if (z->app14_color_transform != 0) goto LAB_00113451;
                      if (psVar28->img_x != 0) {
                        puVar26 = (undefined1 *)((long)pvVar15 + (ulong)(sVar8 * iVar7) + 3);
                        uVar38 = 0;
                        do {
                          bVar5 = *(byte *)(lStack_140 + uVar38);
                          iVar36 = (uint)local_158[0][uVar38] * (uint)bVar5;
                          puVar26[-3] = (char)((iVar36 + 0x80U >> 8) + iVar36 + 0x80 >> 8);
                          iVar36 = (uint)local_158[1][uVar38] * (uint)bVar5;
                          puVar26[-2] = (char)((iVar36 + 0x80U >> 8) + iVar36 + 0x80 >> 8);
                          puVar26[-1] = (char)(((uint)local_158[2][uVar38] * (uint)bVar5 + 0x80 >> 8
                                               ) + (uint)local_158[2][uVar38] * (uint)bVar5 + 0x80
                                              >> 8);
                          *puVar26 = 0xff;
                          uVar38 = uVar38 + 1;
                          puVar26 = puVar26 + (uint)req_comp;
                        } while (uVar38 < psVar28->img_x);
                      }
                    }
                  }
                  else if (psVar28->img_x != 0) {
                    puVar26 = (undefined1 *)((long)pvVar15 + (ulong)(sVar8 * iVar7) + 3);
                    uVar38 = 0;
                    do {
                      sVar6 = local_158[0][uVar38];
                      puVar26[-1] = sVar6;
                      puVar26[-2] = sVar6;
                      puVar26[-3] = sVar6;
                      *puVar26 = 0xff;
                      uVar38 = uVar38 + 1;
                      puVar26 = puVar26 + (uint)req_comp;
                    } while (uVar38 < psVar28->img_x);
                  }
                }
                uVar11 = uVar11 + 1;
                psVar28 = z->s;
                iVar7 = iVar7 + req_comp;
                uVar35 = req_comp;
              } while (uVar11 < psVar28->img_y);
            }
            stbi__free_jpeg_components(z,psVar28->img_n,uVar35);
            psVar28 = z->s;
            *local_100 = psVar28->img_x;
            *local_118 = psVar28->img_y;
            if (local_110 != (int *)0x0) {
              *local_110 = (uint)(2 < psVar28->img_n) * 2 + 1;
            }
            goto LAB_001136be;
          }
          iVar7 = stbi__process_marker(z,(uint)bVar5);
          uVar35 = extraout_EDX_00;
          if (iVar7 != 0) goto LAB_00112bf4;
          goto LAB_001136ad;
        }
        iVar7 = stbi__get16be(z->s);
        psVar28 = z->s;
        pbVar27 = psVar28->img_buffer;
        paVar23 = extraout_RDX_01;
        if (pbVar27 < psVar28->img_buffer_end) {
LAB_001118b0:
          psVar28->img_buffer = pbVar27 + 1;
          bVar5 = *pbVar27;
        }
        else {
          if (psVar28->read_from_callbacks != 0) {
            stbi__refill_buffer(psVar28);
            pbVar27 = psVar28->img_buffer;
            paVar23 = extraout_RDX_02;
            goto LAB_001118b0;
          }
          bVar5 = 0;
        }
        z->scan_n = (uint)bVar5;
        if (((byte)(bVar5 - 5) < 0xfc) || (z->s->img_n < (int)(uint)bVar5)) {
          pcVar12 = "bad SOS component count";
        }
        else {
          if (iVar7 == (uint)bVar5 * 2 + 6) {
            if (bVar5 != 0) {
              lVar13 = 0;
              do {
                psVar28 = z->s;
                pbVar27 = psVar28->img_buffer;
                if (pbVar27 < psVar28->img_buffer_end) {
LAB_0011192a:
                  psVar28->img_buffer = pbVar27 + 1;
                  uVar11 = (uint)*pbVar27;
                }
                else {
                  if (psVar28->read_from_callbacks != 0) {
                    stbi__refill_buffer(psVar28);
                    pbVar27 = psVar28->img_buffer;
                    goto LAB_0011192a;
                  }
                  uVar11 = 0;
                }
                psVar28 = z->s;
                pbVar27 = psVar28->img_buffer;
                if (pbVar27 < psVar28->img_buffer_end) {
LAB_00111966:
                  psVar28->img_buffer = pbVar27 + 1;
                  bVar5 = *pbVar27;
                }
                else {
                  if (psVar28->read_from_callbacks != 0) {
                    stbi__refill_buffer(psVar28);
                    pbVar27 = psVar28->img_buffer;
                    goto LAB_00111966;
                  }
                  bVar5 = 0;
                }
                uVar35 = z->s->img_n;
                if ((int)uVar35 < 1) {
                  uVar38 = 0;
                }
                else {
                  uVar38 = 0;
                  paVar23 = paVar1;
                  do {
                    if (paVar23->id == uVar11) goto LAB_00111999;
                    uVar38 = uVar38 + 1;
                    paVar23 = paVar23 + 1;
                  } while (uVar35 != uVar38);
                  uVar38 = (ulong)uVar35;
                }
LAB_00111999:
                if ((uint)uVar38 == uVar35) goto LAB_001136ad;
                uVar29 = uVar38 & 0xffffffff;
                paVar23 = (anon_struct_96_18_0d0905d3 *)(uVar29 * 0x60);
                z->img_comp[uVar29].hd = (uint)(bVar5 >> 4);
                if (0x3f < bVar5) {
                  pcVar12 = "bad DC huff";
                  goto LAB_001136a4;
                }
                paVar23 = paVar1 + uVar29;
                paVar23->ha = bVar5 & 0xf;
                if (3 < (bVar5 & 0xf)) {
                  pcVar12 = "bad AC huff";
                  goto LAB_001136a4;
                }
                z->order[lVar13] = (uint)uVar38;
                lVar13 = lVar13 + 1;
              } while (lVar13 < z->scan_n);
            }
            psVar28 = z->s;
            pbVar27 = psVar28->img_buffer;
            if (pbVar27 < psVar28->img_buffer_end) {
LAB_00111a2d:
              psVar28->img_buffer = pbVar27 + 1;
              uVar35 = (uint)*pbVar27;
            }
            else {
              if (psVar28->read_from_callbacks != 0) {
                stbi__refill_buffer(psVar28);
                pbVar27 = psVar28->img_buffer;
                goto LAB_00111a2d;
              }
              uVar35 = 0;
            }
            z->spec_start = uVar35;
            psVar28 = z->s;
            pbVar27 = psVar28->img_buffer;
            if (pbVar27 < psVar28->img_buffer_end) {
LAB_00111a71:
              psVar28->img_buffer = pbVar27 + 1;
              uVar35 = (uint)*pbVar27;
            }
            else {
              if (psVar28->read_from_callbacks != 0) {
                stbi__refill_buffer(psVar28);
                pbVar27 = psVar28->img_buffer;
                goto LAB_00111a71;
              }
              uVar35 = 0;
            }
            z->spec_end = uVar35;
            psVar28 = z->s;
            pbVar27 = psVar28->img_buffer;
            if (pbVar27 < psVar28->img_buffer_end) {
LAB_00111ab5:
              psVar28->img_buffer = pbVar27 + 1;
              bVar5 = *pbVar27;
            }
            else {
              if (psVar28->read_from_callbacks != 0) {
                stbi__refill_buffer(psVar28);
                pbVar27 = psVar28->img_buffer;
                goto LAB_00111ab5;
              }
              bVar5 = 0;
            }
            z->succ_high = (uint)(bVar5 >> 4);
            uVar35 = bVar5 & 0xf;
            paVar23 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar35;
            z->succ_low = uVar35;
            iVar7 = z->progressive;
            iVar36 = z->spec_start;
            if (iVar7 == 0) {
              if (((iVar36 != 0) || (0xf < bVar5)) || ((bVar5 & 0xf) != 0)) goto LAB_00112cd3;
              z->spec_end = 0x3f;
            }
            else if (((0x3f < iVar36) || (0x3f < z->spec_end)) ||
                    ((z->spec_end < iVar36 || ((0xdf < bVar5 || (0xd < uVar35)))))) {
LAB_00112cd3:
              pcVar12 = "bad SOS";
              goto LAB_001136a4;
            }
            iVar36 = z->scan_n;
            uVar38 = (ulong)(uint)z->restart_interval;
            if (z->restart_interval == 0) {
              uVar38 = 0x7fffffff;
            }
            z->code_buffer = 0;
            z->code_bits = 0;
            z->nomore = 0;
            z->img_comp[3].dc_pred = 0;
            z->img_comp[2].dc_pred = 0;
            z->img_comp[1].dc_pred = 0;
            z->img_comp[0].dc_pred = 0;
            z->marker = 0xff;
            uVar35 = (uint)uVar38;
            z->todo = uVar35;
            z->eob_run = 0;
            if (iVar7 == 0) {
              if (iVar36 == 1) {
                iVar36 = z->order[0];
                iVar33 = z->img_comp[iVar36].y + 7 >> 3;
                if (0 < iVar33) {
                  uVar11 = paVar1[iVar36].x + 7 >> 3;
                  local_188 = (ulong)uVar11;
                  iVar32 = 0;
                  iVar19 = 0;
                  do {
                    if (0 < (int)uVar11) {
                      lVar13 = 0;
                      do {
                        iVar7 = stbi__jpeg_decode_block
                                          (z,local_f8,z->huff_dc + paVar1[iVar36].hd,
                                           z->huff_ac + paVar1[iVar36].ha,
                                           z->fast_ac[paVar1[iVar36].ha],iVar36,
                                           z->dequant[paVar1[iVar36].tq]);
                        if (iVar7 == 0) {
                          bVar41 = false;
                          local_1bc = 0;
                          uVar38 = extraout_RDX_08;
                        }
                        else {
                          (*z->idct_block_kernel)
                                    (paVar1[iVar36].data + lVar13 + iVar32 * paVar1[iVar36].w2,
                                     paVar1[iVar36].w2,local_f8);
                          iVar7 = z->todo;
                          z->todo = iVar7 + -1;
                          bVar41 = true;
                          uVar38 = extraout_RDX_09;
                          if (iVar7 < 2) {
                            if (z->code_bits < 0x18) {
                              stbi__grow_buffer_unsafe(z);
                              uVar38 = extraout_RDX_10;
                            }
                            if ((z->marker & 0xf8) == 0xd0) {
                              z->code_buffer = 0;
                              z->code_bits = 0;
                              z->nomore = 0;
                              z->img_comp[3].dc_pred = 0;
                              z->img_comp[2].dc_pred = 0;
                              z->img_comp[1].dc_pred = 0;
                              z->img_comp[0].dc_pred = 0;
                              z->marker = 0xff;
                              iVar7 = z->restart_interval;
                              uVar38 = 0x7fffffff;
                              if (iVar7 == 0) {
                                iVar7 = 0x7fffffff;
                              }
                              z->todo = iVar7;
                              z->eob_run = 0;
                            }
                            else {
                              local_1bc = 1;
                              bVar41 = false;
                            }
                          }
                        }
                        uVar35 = (uint)uVar38;
                        iVar7 = local_1bc;
                        if (!bVar41) goto LAB_00112be0;
                        lVar13 = lVar13 + 8;
                      } while (local_188 * 8 != lVar13);
                    }
                    uVar35 = (uint)uVar38;
                    iVar19 = iVar19 + 1;
                    iVar32 = iVar32 + 8;
                  } while (iVar19 != iVar33);
                }
LAB_00112940:
                iVar7 = 1;
              }
              else {
                iVar7 = 1;
                if (0 < z->img_mcu_y) {
                  iVar36 = 0;
                  do {
                    if (0 < z->img_mcu_x) {
                      local_1bc = 0;
                      do {
                        if (0 < z->scan_n) {
                          lVar13 = 0;
                          do {
                            iVar7 = z->order[lVar13];
                            if (0 < z->img_comp[iVar7].v) {
                              iVar33 = 0;
                              bVar41 = true;
                              do {
                                local_188 = CONCAT71(local_188._1_7_,bVar41);
                                iVar19 = paVar1[iVar7].h;
                                if (0 < iVar19) {
                                  iVar32 = 0;
                                  do {
                                    iVar34 = paVar1[iVar7].v;
                                    iVar10 = stbi__jpeg_decode_block
                                                       (z,local_f8,z->huff_dc + paVar1[iVar7].hd,
                                                        z->huff_ac + paVar1[iVar7].ha,
                                                        z->fast_ac[paVar1[iVar7].ha],iVar7,
                                                        z->dequant[paVar1[iVar7].tq]);
                                    uVar35 = (uint)extraout_RDX_12;
                                    if (iVar10 == 0) {
                                      uVar38 = extraout_RDX_12;
                                      if (bVar41 == false) goto LAB_00112ac0;
                                      goto LAB_00112bc5;
                                    }
                                    (*z->idct_block_kernel)
                                              (paVar1[iVar7].data +
                                               (long)((iVar19 * local_1bc + iVar32) * 8) +
                                               (long)((iVar34 * iVar36 + iVar33) * paVar1[iVar7].w2
                                                     * 8),paVar1[iVar7].w2,local_f8);
                                    iVar32 = iVar32 + 1;
                                    iVar19 = paVar1[iVar7].h;
                                    uVar38 = extraout_RDX_13;
                                  } while (iVar32 < iVar19);
                                }
                                iVar33 = iVar33 + 1;
                                bVar41 = iVar33 < paVar1[iVar7].v;
                              } while (iVar33 < paVar1[iVar7].v);
                            }
LAB_00112ac0:
                            lVar13 = lVar13 + 1;
                          } while (lVar13 < z->scan_n);
                        }
                        uVar35 = (uint)uVar38;
                        iVar7 = z->todo;
                        z->todo = iVar7 + -1;
                        if (iVar7 < 2) {
                          if (z->code_bits < 0x18) {
                            stbi__grow_buffer_unsafe(z);
                            uVar35 = extraout_EDX_02;
                          }
                          iVar7 = 1;
                          if ((z->marker & 0xf8) != 0xd0) goto LAB_00112be0;
                          z->code_buffer = 0;
                          z->code_bits = 0;
                          z->nomore = 0;
                          z->img_comp[3].dc_pred = 0;
                          z->img_comp[2].dc_pred = 0;
                          z->img_comp[1].dc_pred = 0;
                          z->img_comp[0].dc_pred = 0;
                          z->marker = 0xff;
                          iVar7 = z->restart_interval;
                          uVar38 = 0x7fffffff;
                          if (iVar7 == 0) {
                            iVar7 = 0x7fffffff;
                          }
                          z->todo = iVar7;
                          z->eob_run = 0;
                        }
                        local_1bc = local_1bc + 1;
                      } while (local_1bc < z->img_mcu_x);
                    }
                    uVar35 = (uint)uVar38;
                    iVar36 = iVar36 + 1;
                    iVar7 = 1;
                  } while (iVar36 < z->img_mcu_y);
                }
              }
            }
            else if (iVar36 == 1) {
              local_120 = (long)z->order[0];
              local_134 = z->img_comp[local_120].y + 7 >> 3;
              iVar7 = 1;
              if (0 < local_134) {
                paVar23 = paVar1 + local_120;
                local_138 = z->img_comp[local_120].x + 7 >> 3;
                iVar36 = 0;
                local_128 = paVar23;
                do {
                  if (0 < local_138) {
                    iVar7 = 0;
                    do {
                      piVar4 = local_130;
                      psVar30 = paVar23->coeff + (paVar23->coeff_w * iVar36 + iVar7) * 0x40;
                      uVar29 = (ulong)z->spec_start;
                      if (uVar29 == 0) {
                        iVar33 = stbi__jpeg_decode_block_prog_dc
                                           (z,psVar30,z->huff_dc + paVar23->hd,(int)local_120);
                        uVar38 = extraout_RDX_04;
                        if (iVar33 != 0) goto LAB_00112144;
                        bVar41 = false;
                        local_188 = 0;
                      }
                      else {
                        lVar13 = (long)paVar23->ha;
                        psVar40 = z->huff_ac + lVar13;
                        local_1bc = z->succ_low;
                        iVar33 = z->eob_run;
                        bVar5 = (byte)local_1bc;
                        if (z->succ_high == 0) {
                          if (iVar33 == 0) {
                            do {
                              if (z->code_bits < 0x10) {
                                stbi__grow_buffer_unsafe(z);
                              }
                              sVar39 = z->fast_ac[lVar13][z->code_buffer >> 0x17];
                              uVar35 = (uint)sVar39;
                              iVar33 = (int)uVar29;
                              if (sVar39 == 0) {
                                if (z->code_bits < 0x10) {
                                  stbi__grow_buffer_unsafe(z);
                                }
                                uVar35 = z->code_buffer;
                                uVar14 = (ulong)uVar35;
                                uVar38 = (ulong)psVar40->fast[uVar35 >> 0x17];
                                if (uVar38 == 0xff) {
                                  lVar20 = 0;
                                  do {
                                    lVar31 = lVar20;
                                    lVar20 = lVar31 + 1;
                                  } while ((uint)piVar4[lVar13 * 0x1a4 + lVar31 + -0x11] <=
                                           uVar35 >> 0x10);
                                  iVar19 = z->code_bits;
                                  if (lVar20 == 8) {
                                    z->code_bits = iVar19 + -0x10;
                                    uVar11 = 0xffffffff;
                                  }
                                  else {
                                    uVar11 = 0xffffffff;
                                    if ((int)(lVar31 + 10) <= iVar19) {
                                      iVar32 = (uVar35 >> (0x17U - (char)lVar20 & 0x1f) &
                                               stbi__bmask[lVar31 + 10]) +
                                               piVar4[lVar13 * 0x1a4 + lVar20];
                                      if ((uVar35 >> (-psVar40->size[iVar32] & 0x1f) &
                                          stbi__bmask[psVar40->size[iVar32]]) !=
                                          (uint)psVar40->code[iVar32]) goto LAB_00113703;
                                      uVar35 = uVar35 << ((byte)(lVar31 + 10) & 0x1f);
                                      uVar14 = (ulong)uVar35;
                                      z->code_bits = (iVar19 - (int)lVar20) + -9;
                                      z->code_buffer = uVar35;
                                      uVar11 = (uint)psVar40->values[iVar32];
                                    }
                                  }
                                }
                                else {
                                  bVar2 = psVar40->size[uVar38];
                                  uVar11 = 0xffffffff;
                                  if ((int)(uint)bVar2 <= z->code_bits) {
                                    uVar35 = uVar35 << (bVar2 & 0x1f);
                                    uVar14 = (ulong)uVar35;
                                    z->code_buffer = uVar35;
                                    z->code_bits = z->code_bits - (uint)bVar2;
                                    uVar11 = (uint)psVar40->values[uVar38];
                                  }
                                }
                                if ((int)uVar11 < 0) {
                                  *(char **)(in_FS_OFFSET + -0x20) = "bad huffman code";
                                  iVar33 = 1;
                                  uVar38 = 0;
                                }
                                else {
                                  uVar35 = uVar11 >> 4;
                                  uVar37 = uVar11 & 0xf;
                                  if (uVar37 == 0) {
                                    if (uVar11 < 0xf0) {
                                      z->eob_run = 1 << ((byte)uVar35 & 0x1f);
                                      if (0xf < uVar11) {
                                        if (z->code_bits < (int)uVar35) {
                                          stbi__grow_buffer_unsafe(z);
                                        }
                                        bVar2 = (byte)uVar35 & 0x1f;
                                        uVar37 = z->code_buffer << bVar2 |
                                                 z->code_buffer >> 0x20 - bVar2;
                                        uVar11 = stbi__bmask[uVar35];
                                        z->code_buffer = ~uVar11 & uVar37;
                                        z->code_bits = z->code_bits - uVar35;
                                        z->eob_run = z->eob_run + (uVar37 & uVar11);
                                      }
                                      z->eob_run = z->eob_run + -1;
                                      iVar33 = 2;
                                      uVar38 = 0;
                                      goto LAB_00112556;
                                    }
                                    uVar35 = iVar33 + 0x10;
                                  }
                                  else {
                                    lVar20 = (long)iVar33 + (ulong)uVar35;
                                    bVar2 = ""[lVar20];
                                    if (z->code_bits < (int)uVar37) {
                                      stbi__grow_buffer_unsafe(z);
                                    }
                                    uVar35 = z->code_buffer;
                                    uVar9 = uVar35 << (sbyte)uVar37 | uVar35 >> 0x20 - (sbyte)uVar37
                                    ;
                                    uVar11 = *(uint *)((long)stbi__bmask + (ulong)(uVar37 * 4));
                                    z->code_buffer = ~uVar11 & uVar9;
                                    z->code_bits = z->code_bits - uVar37;
                                    iVar33 = 0;
                                    if (-1 < (int)uVar35) {
                                      iVar33 = *(int *)((long)stbi__jbias + (ulong)(uVar37 * 4));
                                    }
                                    uVar11 = (uVar9 & uVar11) + iVar33 << (bVar5 & 0x1f);
                                    uVar14 = (ulong)uVar11;
                                    uVar35 = (int)lVar20 + 1;
                                    psVar30[bVar2] = (short)uVar11;
                                  }
                                  iVar33 = 0;
                                  uVar29 = (ulong)uVar35;
                                  uVar38 = CONCAT71((int7)(uVar14 >> 8),1);
                                }
                              }
                              else {
                                z->code_buffer = z->code_buffer << (sbyte)(uVar35 & 0xf);
                                z->code_bits = z->code_bits - (uVar35 & 0xf);
                                lVar20 = (long)iVar33 + (ulong)(uVar35 >> 4 & 0xf);
                                uVar29 = (ulong)((int)lVar20 + 1);
                                psVar30[""[lVar20]] = (short)((uVar35 >> 8) << (bVar5 & 0x1f));
                                iVar33 = 0 << (bVar5 & 0x1f);
                                uVar38 = 1;
                              }
LAB_00112556:
                              bVar41 = false;
                              uVar14 = 1;
                              if (iVar33 != 0) {
                                bVar41 = false;
                                if (iVar33 != 2) {
                                  uVar14 = uVar38;
                                  bVar41 = false;
                                }
                                break;
                              }
                            } while ((int)uVar29 <= z->spec_end);
                          }
                          else {
                            z->eob_run = iVar33 + -1;
                            uVar14 = 0;
                            bVar41 = true;
                          }
                          if ((char)uVar14 != '\0') goto LAB_00112119;
                        }
                        else {
                          if (iVar33 == 0) {
                            uVar35 = (0x10000 << (bVar5 & 0x1f)) >> 0x10;
                            local_108 = psVar40;
                            do {
                              if (z->code_bits < 0x10) {
                                stbi__grow_buffer_unsafe(z);
                              }
                              uVar11 = z->code_buffer;
                              uVar38 = (ulong)uVar11;
                              uVar14 = (ulong)psVar40->fast[uVar11 >> 0x17];
                              if (uVar14 == 0xff) {
                                lVar20 = 0;
                                do {
                                  lVar31 = lVar20;
                                  lVar20 = lVar31 + 1;
                                } while ((uint)piVar4[lVar13 * 0x1a4 + lVar31 + -0x11] <=
                                         uVar11 >> 0x10);
                                iVar33 = z->code_bits;
                                if (lVar20 == 8) {
                                  z->code_bits = iVar33 + -0x10;
                                  uVar37 = 0xffffffff;
                                }
                                else {
                                  uVar37 = 0xffffffff;
                                  if ((int)(lVar31 + 10) <= iVar33) {
                                    iVar19 = (uVar11 >> (0x17U - (char)lVar20 & 0x1f) &
                                             stbi__bmask[lVar31 + 10]) +
                                             piVar4[lVar13 * 0x1a4 + lVar20];
                                    if ((uVar11 >> (-psVar40->size[iVar19] & 0x1f) &
                                        stbi__bmask[psVar40->size[iVar19]]) !=
                                        (uint)psVar40->code[iVar19]) {
LAB_00113703:
                                      __assert_fail(
                                                  "(((j->code_buffer) >> (32 - h->size[c])) & stbi__bmask[h->size[c]]) == h->code[c]"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Yousazoe[P]RayTracing-Dev/vendor/stb/stb_image.h"
                                                  ,0x843,
                                                  "int stbi__jpeg_huff_decode(stbi__jpeg *, stbi__huffman *)"
                                                  );
                                    }
                                    uVar11 = uVar11 << ((byte)(lVar31 + 10) & 0x1f);
                                    uVar38 = (ulong)uVar11;
                                    z->code_bits = (iVar33 - (int)lVar20) + -9;
                                    z->code_buffer = uVar11;
                                    uVar37 = (uint)psVar40->values[iVar19];
                                  }
                                }
                              }
                              else {
                                bVar2 = psVar40->size[uVar14];
                                uVar37 = 0xffffffff;
                                if ((int)(uint)bVar2 <= z->code_bits) {
                                  uVar11 = uVar11 << (bVar2 & 0x1f);
                                  uVar38 = (ulong)uVar11;
                                  z->code_buffer = uVar11;
                                  z->code_bits = z->code_bits - (uint)bVar2;
                                  uVar37 = (uint)psVar40->values[uVar14];
                                }
                              }
                              if ((int)uVar37 < 0) {
                                *(char **)(in_FS_OFFSET + -0x20) = "bad huffman code";
                                bVar41 = false;
                              }
                              else {
                                uVar11 = uVar37 >> 4;
                                if ((uVar37 & 0xf) == 1) {
                                  if (z->code_bits < 1) {
                                    stbi__grow_buffer_unsafe(z);
                                    uVar38 = extraout_RDX_05;
                                  }
                                  uVar37 = z->code_buffer;
                                  z->code_buffer = uVar37 * 2;
                                  z->code_bits = z->code_bits + -1;
                                  sVar39 = (short)(((int)~uVar37 >> 0x1f | 1U) << (bVar5 & 0x1f));
                                }
                                else {
                                  if ((uVar37 & 0xf) != 0) {
                                    *(char **)(in_FS_OFFSET + -0x20) = "bad huffman code";
                                    bVar41 = false;
                                    goto LAB_00112103;
                                  }
                                  if (uVar37 < 0xf0) {
                                    z->eob_run = ~(-1 << ((byte)uVar11 & 0x1f));
                                    if (0xf < uVar37) {
                                      if (z->code_bits < (int)uVar11) {
                                        stbi__grow_buffer_unsafe(z);
                                      }
                                      bVar2 = (byte)uVar11 & 0x1f;
                                      uVar9 = z->code_buffer << bVar2 |
                                              z->code_buffer >> 0x20 - bVar2;
                                      uVar37 = stbi__bmask[uVar11];
                                      uVar22 = ~uVar37 & uVar9;
                                      uVar38 = (ulong)uVar22;
                                      z->code_buffer = uVar22;
                                      z->code_bits = z->code_bits - uVar11;
                                      z->eob_run = z->eob_run + (uVar9 & uVar37);
                                    }
                                    sVar39 = 0;
                                    uVar11 = 0x40;
                                  }
                                  else {
                                    sVar39 = 0;
                                    uVar11 = 0xf;
                                  }
                                }
                                uVar29 = (ulong)(int)uVar29;
                                do {
                                  if ((long)z->spec_end < (long)uVar29) break;
                                  bVar2 = ""[uVar29];
                                  if (psVar30[bVar2] == 0) {
                                    if (uVar11 == 0) {
                                      psVar30[bVar2] = sVar39;
                                      bVar41 = false;
                                      uVar11 = 0;
                                    }
                                    else {
                                      uVar11 = uVar11 - 1;
                                      bVar41 = true;
                                    }
                                  }
                                  else {
                                    if (z->code_bits < 1) {
                                      stbi__grow_buffer_unsafe(z);
                                      uVar38 = extraout_RDX_06;
                                    }
                                    sVar8 = z->code_buffer;
                                    z->code_buffer = sVar8 * 2;
                                    z->code_bits = z->code_bits + -1;
                                    bVar41 = true;
                                    if (((int)sVar8 < 0) &&
                                       (sVar3 = psVar30[bVar2], (uVar35 & (int)sVar3) == 0)) {
                                      uVar37 = uVar35;
                                      if (sVar3 < 1) {
                                        uVar37 = -uVar35;
                                      }
                                      psVar30[bVar2] = sVar3 + (short)uVar37;
                                    }
                                  }
                                  uVar29 = uVar29 + 1;
                                } while (bVar41);
                                bVar41 = true;
                                psVar40 = local_108;
                              }
LAB_00112103:
                              if (!bVar41) {
                                bVar41 = false;
                                goto LAB_0011211e;
                              }
                            } while ((int)uVar29 <= z->spec_end);
                          }
                          else {
                            z->eob_run = iVar33 + -1;
                            if (z->spec_start <= z->spec_end) {
                              uVar35 = (0x10000 << (bVar5 & 0x1f)) >> 0x10;
                              do {
                                bVar5 = ""[uVar29];
                                if (psVar30[bVar5] != 0) {
                                  if (z->code_bits < 1) {
                                    stbi__grow_buffer_unsafe(z);
                                    uVar38 = extraout_RDX_03;
                                  }
                                  sVar8 = z->code_buffer;
                                  z->code_buffer = sVar8 * 2;
                                  z->code_bits = z->code_bits + -1;
                                  if (((int)sVar8 < 0) &&
                                     (sVar39 = psVar30[bVar5], (uVar35 & (int)sVar39) == 0)) {
                                    uVar11 = -uVar35;
                                    if (0 < sVar39) {
                                      uVar11 = uVar35;
                                    }
                                    psVar30[bVar5] = (short)uVar11 + sVar39;
                                  }
                                }
                                bVar41 = (long)uVar29 < (long)z->spec_end;
                                uVar29 = uVar29 + 1;
                              } while (bVar41);
                            }
                          }
LAB_00112119:
                          bVar41 = true;
                        }
LAB_0011211e:
                        if (!bVar41) {
                          local_188._0_4_ = 0;
                        }
                        local_188 = (ulong)(uint)local_188;
                        paVar23 = local_128;
                        if (!bVar41) {
                          bVar41 = false;
                        }
                        else {
LAB_00112144:
                          iVar33 = z->todo;
                          z->todo = iVar33 + -1;
                          bVar41 = true;
                          if (iVar33 < 2) {
                            if (z->code_bits < 0x18) {
                              stbi__grow_buffer_unsafe(z);
                              uVar38 = extraout_RDX_07;
                            }
                            if ((z->marker & 0xf8) == 0xd0) {
                              z->code_buffer = 0;
                              z->code_bits = 0;
                              z->nomore = 0;
                              z->img_comp[3].dc_pred = 0;
                              z->img_comp[2].dc_pred = 0;
                              z->img_comp[1].dc_pred = 0;
                              z->img_comp[0].dc_pred = 0;
                              z->marker = 0xff;
                              iVar33 = z->restart_interval;
                              uVar38 = 0x7fffffff;
                              if (iVar33 == 0) {
                                iVar33 = 0x7fffffff;
                              }
                              z->todo = iVar33;
                              z->eob_run = 0;
                            }
                            else {
                              local_188 = 1;
                              bVar41 = false;
                            }
                          }
                        }
                      }
                      uVar35 = (uint)uVar38;
                      if (!bVar41) {
                        iVar7 = (int)local_188;
                        goto LAB_00112be0;
                      }
                      iVar7 = iVar7 + 1;
                    } while (iVar7 != local_138);
                  }
                  uVar35 = (uint)uVar38;
                  iVar7 = 1;
                  iVar36 = iVar36 + 1;
                } while (iVar36 != local_134);
              }
            }
            else {
              iVar7 = 1;
              if (0 < z->img_mcu_y) {
                iVar7 = 0;
                do {
                  if (0 < z->img_mcu_x) {
                    iVar36 = 0;
                    do {
                      if (0 < z->scan_n) {
                        lVar13 = 0;
                        do {
                          iVar33 = z->order[lVar13];
                          if (0 < z->img_comp[iVar33].v) {
                            iVar19 = 0;
                            bVar41 = true;
LAB_001127e2:
                            iVar32 = paVar1[iVar33].h;
                            if (iVar32 < 1) goto LAB_00112842;
                            iVar34 = 0;
                            while( true ) {
                              iVar32 = stbi__jpeg_decode_block_prog_dc
                                                 (z,paVar1[iVar33].coeff +
                                                    (iVar32 * iVar36 + iVar34 +
                                                    (paVar1[iVar33].v * iVar7 + iVar19) *
                                                    paVar1[iVar33].coeff_w) * 0x40,
                                                  z->huff_dc + paVar1[iVar33].hd,iVar33);
                              uVar35 = (uint)extraout_RDX_11;
                              uVar38 = extraout_RDX_11;
                              if (iVar32 == 0) break;
                              iVar34 = iVar34 + 1;
                              iVar32 = paVar1[iVar33].h;
                              if (iVar32 <= iVar34) goto LAB_00112842;
                            }
                            if (!bVar41) goto LAB_0011285a;
LAB_00112bc5:
                            iVar7 = 0;
                            goto LAB_00112be0;
                          }
LAB_0011285a:
                          lVar13 = lVar13 + 1;
                        } while (lVar13 < z->scan_n);
                      }
                      uVar35 = (uint)uVar38;
                      iVar33 = z->todo;
                      z->todo = iVar33 + -1;
                      if (iVar33 < 2) {
                        if (z->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(z);
                          uVar35 = extraout_EDX_01;
                        }
                        if ((z->marker & 0xf8) != 0xd0) goto LAB_00112940;
                        z->code_buffer = 0;
                        z->code_bits = 0;
                        z->nomore = 0;
                        z->img_comp[3].dc_pred = 0;
                        z->img_comp[2].dc_pred = 0;
                        z->img_comp[1].dc_pred = 0;
                        z->img_comp[0].dc_pred = 0;
                        z->marker = 0xff;
                        iVar33 = z->restart_interval;
                        uVar38 = 0x7fffffff;
                        if (iVar33 == 0) {
                          iVar33 = 0x7fffffff;
                        }
                        z->todo = iVar33;
                        z->eob_run = 0;
                      }
                      iVar36 = iVar36 + 1;
                    } while (iVar36 < z->img_mcu_x);
                  }
                  uVar35 = (uint)uVar38;
                  iVar7 = iVar7 + 1;
                } while (iVar7 < z->img_mcu_y);
                goto LAB_00112940;
              }
            }
LAB_00112be0:
            if (iVar7 != 0) {
              if (z->marker != 0xff) goto LAB_00112bf4;
LAB_00112c01:
              do {
                psVar28 = z->s;
                if ((psVar28->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00112c1d:
                  if (psVar28->img_buffer_end <= psVar28->img_buffer) goto LAB_00112bf4;
                }
                else {
                  iVar7 = (*(psVar28->io).eof)(psVar28->io_user_data);
                  if (iVar7 != 0) {
                    if (psVar28->read_from_callbacks != 0) goto LAB_00112c1d;
                    goto LAB_00112bf4;
                  }
                }
                psVar28 = z->s;
                psVar18 = psVar28->img_buffer;
                if (psVar28->img_buffer_end <= psVar18) {
                  if (psVar28->read_from_callbacks == 0) goto LAB_00112c01;
                  stbi__refill_buffer(psVar28);
                  psVar18 = psVar28->img_buffer;
                }
                psVar28->img_buffer = psVar18 + 1;
              } while (*psVar18 != 0xff);
              psVar28 = z->s;
              psVar18 = psVar28->img_buffer;
              if (psVar18 < psVar28->img_buffer_end) {
LAB_00112c91:
                psVar28->img_buffer = psVar18 + 1;
                sVar6 = *psVar18;
              }
              else {
                if (psVar28->read_from_callbacks != 0) {
                  stbi__refill_buffer(psVar28);
                  psVar18 = psVar28->img_buffer;
                  goto LAB_00112c91;
                }
                sVar6 = '\0';
              }
              z->marker = sVar6;
              goto LAB_00112bf4;
            }
            goto LAB_001136ad;
          }
          pcVar12 = "bad SOS len";
        }
LAB_001136a4:
        uVar35 = (uint)paVar23;
        *(char **)(in_FS_OFFSET + -0x20) = pcVar12;
      }
LAB_001136ad:
      uVar11 = z->s->img_n;
LAB_001136b4:
      stbi__free_jpeg_components(z,uVar11,uVar35);
    }
    else {
      pcVar12 = "bad req_comp";
LAB_0011174a:
      *(char **)(in_FS_OFFSET + -0x20) = pcVar12;
    }
LAB_001136bc:
    pvVar15 = (void *)0x0;
LAB_001136be:
    free(z);
  }
  return pvVar15;
LAB_00112842:
  iVar19 = iVar19 + 1;
  bVar41 = iVar19 < paVar1[iVar33].v;
  if (paVar1[iVar33].v <= iVar19) goto LAB_0011285a;
  goto LAB_001127e2;
LAB_00112bf4:
  bVar5 = stbi__get_marker(z);
  uVar24 = extraout_RDX_14;
  goto LAB_00111817;
}

Assistant:

static void *stbi__jpeg_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   unsigned char* result;
   stbi__jpeg* j = (stbi__jpeg*) stbi__malloc(sizeof(stbi__jpeg));
   if (!j) return stbi__errpuc("outofmem", "Out of memory");
   STBI_NOTUSED(ri);
   j->s = s;
   stbi__setup_jpeg(j);
   result = load_jpeg_image(j, x,y,comp,req_comp);
   STBI_FREE(j);
   return result;
}